

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::SubmitCommandBuffer::execute
          (SubmitCommandBuffer *this,ExecuteContext *context)

{
  VkSemaphore *pVVar1;
  VkCommandBuffer pVVar2;
  Context *pCVar3;
  VkCommandBuffer_s **ppVVar4;
  Handle<(vk::HandleType)6> local_80;
  undefined4 local_78 [2];
  VkSubmitInfo submit;
  VkQueue queue;
  VkCommandBuffer cmd;
  DeviceInterface *vkd;
  ExecuteContext *context_local;
  SubmitCommandBuffer *this_local;
  
  vkd = (DeviceInterface *)context;
  context_local = (ExecuteContext *)this;
  pCVar3 = ExecuteContext::getContext(context);
  cmd = (VkCommandBuffer)Context::getDeviceInterface(pCVar3);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  queue = (VkQueue)*ppVVar4;
  pCVar3 = ExecuteContext::getContext((ExecuteContext *)vkd);
  submit.pSignalSemaphores = (VkSemaphore *)Context::getQueue(pCVar3);
  memset(local_78,0,0x48);
  pVVar2 = cmd;
  pVVar1 = submit.pSignalSemaphores;
  local_78[0] = 4;
  submit.pWaitDstStageMask._0_4_ = 1;
  submit._40_8_ = &queue;
  ::vk::Handle<(vk::HandleType)6>::Handle(&local_80,0);
  (**(code **)(*(long *)pVVar2 + 0x10))(pVVar2,pVVar1,1,local_78,local_80.m_internal);
  return;
}

Assistant:

void SubmitCommandBuffer::execute (ExecuteContext& context)
{
	const vk::DeviceInterface&	vkd		= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	cmd		= *m_commandBuffer;
	const vk::VkQueue			queue	= context.getContext().getQueue();
	const vk::VkSubmitInfo		submit	=
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,

		0,
		DE_NULL,
		(const vk::VkPipelineStageFlags*)DE_NULL,

		1,
		&cmd,

		0,
		DE_NULL
	};

	vkd.queueSubmit(queue, 1, &submit, 0);
}